

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<QTzTransitionTime>::emplace<QTzTransitionTime_const&>
          (QPodArrayOps<QTzTransitionTime> *this,qsizetype i,QTzTransitionTime *args)

{
  QTzTransitionTime **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qint64 qVar4;
  quint8 qVar5;
  undefined7 uVar6;
  QTzTransitionTime *pQVar7;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QTzTransitionTime>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0040354c:
    qVar4 = args->atMSecsSinceEpoch;
    qVar5 = args->ruleIndex;
    uVar6 = *(undefined7 *)&args->field_0x9;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QTzTransitionTime>).size != 0)
    ;
    QArrayDataPointer<QTzTransitionTime>::detachAndGrow
              (&this->super_QArrayDataPointer<QTzTransitionTime>,where,1,(QTzTransitionTime **)0x0,
               (QArrayDataPointer<QTzTransitionTime> *)0x0);
    pQVar7 = createHole(this,where,i,1);
    pQVar7->atMSecsSinceEpoch = qVar4;
    pQVar7->ruleIndex = qVar5;
    *(undefined7 *)&pQVar7->field_0x9 = uVar6;
  }
  else {
    if (((this->super_QArrayDataPointer<QTzTransitionTime>).size == i) &&
       (pQVar7 = (this->super_QArrayDataPointer<QTzTransitionTime>).ptr,
       (pDVar3->super_QArrayData).alloc !=
       ((long)((long)pQVar7 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) +
       i)) {
      qVar5 = args->ruleIndex;
      uVar6 = *(undefined7 *)&args->field_0x9;
      pQVar7 = pQVar7 + i;
      pQVar7->atMSecsSinceEpoch = args->atMSecsSinceEpoch;
      pQVar7->ruleIndex = qVar5;
      *(undefined7 *)&pQVar7->field_0x9 = uVar6;
    }
    else {
      if ((i != 0) ||
         (pQVar7 = (this->super_QArrayDataPointer<QTzTransitionTime>).ptr,
         (QTzTransitionTime *)
         ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar7))
      goto LAB_0040354c;
      qVar5 = args->ruleIndex;
      uVar6 = *(undefined7 *)&args->field_0x9;
      pQVar7[-1].atMSecsSinceEpoch = args->atMSecsSinceEpoch;
      pQVar7[-1].ruleIndex = qVar5;
      *(undefined7 *)&pQVar7[-1].field_0x9 = uVar6;
      ppQVar1 = &(this->super_QArrayDataPointer<QTzTransitionTime>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QTzTransitionTime>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }